

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

void __thiscall clipp::parser::parser(parser *this,group *root,arg_index offset)

{
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  local_40;
  anon_class_8_1_8991fb9c local_28;
  
  this->root_ = root;
  detail::scoped_dfs_traverser::scoped_dfs_traverser(&this->pos_,root);
  this->index_ = offset + -1;
  *(undefined8 *)&this->eaten_ = 0;
  *(undefined8 *)
   ((long)&(this->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->args_).
           super__Vector_base<clipp::parser::arg_mapping,_std::allocator<clipp::parser::arg_mapping>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  *(undefined8 *)
   ((long)&(this->missCand_).
           super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined8 *)
   ((long)&(this->missCand_).
           super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->missCand_).
           super__Vector_base<clipp::parser::miss_candidate,_std::allocator<clipp::parser::miss_candidate>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  group::depth_first_traverser::depth_first_traverser((depth_first_traverser *)&local_40,root);
  local_28.this = this;
  for_each_potential_miss<clipp::parser::for_each_potential_miss(clipp::group_const&,int)::_lambda(clipp::group::depth_first_traverser_const&)_1_>
            ((dfs_traverser *)&local_40,&local_28);
  std::
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::~_Vector_base(&local_40);
  return;
}

Assistant:

explicit
    parser(const group& root, arg_index offset = 0):
        root_{&root}, pos_{root},
        index_{offset-1}, eaten_{0},
        args_{}, missCand_{}, blocked_{false}
    {
        for_each_potential_miss(dfs_traverser{root},
            [this](const dfs_traverser& p){
                missCand_.emplace_back(p, index_);
            });
    }